

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

URegistryKey __thiscall
icu_63::ICUService::registerFactory
          (ICUService *this,ICUServiceFactory *factoryToAdopt,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  UVector *this_00;
  undefined1 *size;
  UVector *local_60;
  Mutex local_30;
  Mutex mutex;
  UErrorCode *status_local;
  ICUServiceFactory *factoryToAdopt_local;
  ICUService *this_local;
  
  mutex.fMutex = (UMutex *)status;
  UVar2 = ::U_SUCCESS(*status);
  status_local = (UErrorCode *)factoryToAdopt;
  if ((UVar2 == '\0') || (factoryToAdopt == (ICUServiceFactory *)0x0)) goto LAB_0036be6d;
  size = icu_63::lock;
  Mutex::Mutex(&local_30,(UMutex *)icu_63::lock);
  if (this->factories == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_60 = (UVector *)0x0;
    if (this_00 != (UVector *)0x0) {
      UVector::UVector(this_00,deleteUObject,(UElementsAreEqual *)0x0,(UErrorCode *)mutex.fMutex);
      local_60 = this_00;
    }
    this->factories = local_60;
    UVar2 = ::U_FAILURE(((mutex.fMutex)->fMutex).__data.__lock);
    if (UVar2 == '\0') goto LAB_0036bde1;
    if (this->factories != (UVector *)0x0) {
      (*(this->factories->super_UObject)._vptr_UObject[1])();
    }
    this_local = (ICUService *)0x0;
    bVar1 = true;
  }
  else {
LAB_0036bde1:
    UVector::insertElementAt(this->factories,factoryToAdopt,0,(UErrorCode *)mutex.fMutex);
    UVar2 = ::U_SUCCESS(((mutex.fMutex)->fMutex).__data.__lock);
    if (UVar2 == '\0') {
      if (factoryToAdopt != (ICUServiceFactory *)0x0) {
        (*(factoryToAdopt->super_UObject)._vptr_UObject[1])();
      }
      status_local = (UErrorCode *)0x0;
    }
    else {
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])();
    }
    bVar1 = false;
  }
  Mutex::~Mutex(&local_30);
  if (bVar1) {
    return this_local;
  }
LAB_0036be6d:
  if (status_local != (UErrorCode *)0x0) {
    (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])();
  }
  return status_local;
}

Assistant:

URegistryKey
ICUService::registerFactory(ICUServiceFactory* factoryToAdopt, UErrorCode& status) 
{
    if (U_SUCCESS(status) && factoryToAdopt != NULL) {
        Mutex mutex(&lock);

        if (factories == NULL) {
            factories = new UVector(deleteUObject, NULL, status);
            if (U_FAILURE(status)) {
                delete factories;
                return NULL;
            }
        }
        factories->insertElementAt(factoryToAdopt, 0, status);
        if (U_SUCCESS(status)) {
            clearCaches();
        } else {
            delete factoryToAdopt;
            factoryToAdopt = NULL;
        }
    }

    if (factoryToAdopt != NULL) {
        notifyChanged();
    }

    return (URegistryKey)factoryToAdopt;
}